

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

void ext_defs(GlobalVars *gv,FILE *f,LinkedSection *sec,uint8_t bind,uint8_t stype,uint32_t xdeftype
             )

{
  node *pnVar1;
  bool bVar2;
  size_t sVar3;
  char in_CL;
  long in_RDX;
  FILE *in_RSI;
  char in_R8B;
  int in_R9D;
  bool xdefs;
  Symbol *sym;
  Symbol *nextsym;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  FILE *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  node *local_30;
  
  iVar4 = 0;
  pnVar1 = *(node **)(in_RDX + 0xb8);
  while (local_30 = pnVar1, pnVar1 = local_30->next, pnVar1 != (node *)0x0) {
    if (((*(char *)&local_30[4].next == in_R8B) && (*(char *)((long)&local_30[4].next + 3) == in_CL)
        ) && (*(byte *)((long)&local_30[4].next + 2) < 3)) {
      remnode(local_30);
      bVar2 = discard_symbol((GlobalVars *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                             (Symbol *)in_stack_ffffffffffffffc0);
      if (bVar2 == 0) {
        if (in_R9D == 0x100) {
          if ((in_R8B == '\x03') && (((ulong)local_30[4].next & 0x200) == 0)) {
            error(0x5d,fff_amigahunk.tname,local_30[2].next);
          }
        }
        else {
          if (iVar4 == 0) {
            iVar4 = 1;
            if (in_R9D == 0) {
              if (symhunk == 0) {
                symhunk = 1;
                fwrite32be(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
              }
            }
            else if (exthunk == 0) {
              exthunk = 1;
              fwrite32be(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
            }
          }
          if ((in_R9D == 0) && (sVar3 = strlen((char *)local_30[2].next), 0x7c < sVar3)) {
            fwrite32be(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
            fwritex(in_stack_ffffffffffffffc0,
                    (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0x124a88);
          }
          else {
            in_stack_ffffffffffffffbc = in_R9D << 0x18;
            in_stack_ffffffffffffffc0 = in_RSI;
            strlen32((char *)in_RSI);
            fwrite32be(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
            hunk_name(in_stack_ffffffffffffffc0,
                      (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          }
          fwrite32be(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        }
      }
    }
  }
  return;
}

Assistant:

static void ext_defs(struct GlobalVars *gv,FILE *f,struct LinkedSection *sec,
                     uint8_t bind,uint8_t stype,uint32_t xdeftype)
{
  struct Symbol *nextsym,*sym=(struct Symbol *)sec->symbols.first;
  bool xdefs = FALSE;

  while (nextsym = (struct Symbol *)sym->n.next) {
    if (sym->type==stype && sym->bind==bind && sym->info<=SYMI_FUNC) {
      remnode(&sym->n);

      if (!discard_symbol(gv,sym)) {
        if (xdeftype != EXT_IGNORE) {
          if (!xdefs) {
            xdefs = TRUE;
            if (xdeftype == EXT_SYMB) {
              if (!symhunk) {
                symhunk = TRUE;
                fwrite32be(f,HUNK_SYMBOL);
              }
            }
            else {
              if (!exthunk) {
                exthunk = TRUE;
                fwrite32be(f,HUNK_EXT);
              }
            }
          }
          /* generate xdef or symbol table entry */
          if (xdeftype==EXT_SYMB && strlen(sym->name)>124) {
            /* LoadSeg<=V40 doesn't allow more than 31 longwords per symbol,
               and will respond with "bad loadfile hunk" otherwise -
               so just strip the rest! */
            fwrite32be(f,(xdeftype << 24) | 31);
            fwritex(f,sym->name,124);
          }
          else {
            fwrite32be(f,(xdeftype << 24) | strlen32(sym->name));
            hunk_name(f,sym->name);           /* write symbol's name */
          }
          fwrite32be(f,(uint32_t)sym->value);  /* ... and its value */
        }

        else { /* EXT_IGNORE */
          if (stype==SYM_COMMON && !(sym->flags & SYMF_REFERENCED))
            /* Warning: unreferenced common symbol will disappear! */
            error(93,fff_amigahunk.tname,sym->name);
        }
      }
    }
    sym = nextsym;
  }
}